

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

void Fra_SmlSavePattern1(Fra_Man_t *p,int fInit)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  memset(p->pPatWords,0xff,(long)p->nPatWords << 2);
  if (fInit != 0) {
    pAVar1 = p->pManAig;
    iVar3 = pAVar1->nObjs[2] - pAVar1->nRegs;
    iVar4 = 0;
    while( true ) {
      iVar2 = iVar3 + iVar4;
      if (pAVar1->vCis->nSize <= iVar2) break;
      Vec_PtrEntry(pAVar1->vCis,iVar2);
      iVar2 = p->nFramesAll * iVar3 + iVar4;
      p->pPatWords[iVar2 >> 5] = p->pPatWords[iVar2 >> 5] ^ 1 << ((byte)iVar2 & 0x1f);
      iVar4 = iVar4 + 1;
      pAVar1 = p->pManAig;
    }
  }
  return;
}

Assistant:

void Fra_SmlSavePattern1( Fra_Man_t * p, int fInit )
{
    Aig_Obj_t * pObj;
    int i, k, nTruePis;
    memset( p->pPatWords, 0xff, sizeof(unsigned) * p->nPatWords );
    if ( !fInit )
        return;
    // clear the state bits to correspond to all-0 initial state
    nTruePis = Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig);
    k = 0;
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
        Abc_InfoXorBit( p->pPatWords, nTruePis * p->nFramesAll + k++ );
}